

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

void Gia_ManTerAnalyze(Gia_ManTer_t *p)

{
  int iVar1;
  int nConsts;
  int nZeros;
  int i;
  Gia_ManTer_t *p_local;
  
  for (nConsts = 0; iVar1 = Gia_ManRegNum(p->pAig), nConsts < iVar1; nConsts = nConsts + 1) {
    Vec_PtrSize(p->vStates);
  }
  return;
}

Assistant:

void Gia_ManTerAnalyze( Gia_ManTer_t * p )
{
    int i, nZeros = 0, nConsts = 0;
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) )
            nZeros++;
        else if ( p->pCountX[i] == 0 )
            nConsts++;
//    printf( "Found %d constant registers.\n", nZeros );
//    printf( "Found %d non-ternary registers.\n", nConsts );
}